

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_Mesh * __thiscall ON_Mesh::MeshPart(ON_Mesh *this,ON_MeshPart *mesh_part,ON_Mesh *mesh)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int face_count;
  ON_Mesh *this_00;
  char *sFormat;
  long lVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  bool bHidden;
  ON_MeshFace local_98;
  ON_Mesh *local_80;
  ON_SimpleArray<bool> *local_78;
  ON_SimpleArray<ON_SurfaceCurvature> *local_70;
  ON_SimpleArray<ON_2dPoint> *local_68;
  ON_SimpleArray<ON_Color> *local_60;
  ON_SimpleArray<ON_2fPoint> *local_58;
  ON_SimpleArray<ON_3fVector> *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (this == mesh) {
    sFormat = "ON_Mesh::MeshPart this == mesh";
    iVar22 = 0x2dbf;
  }
  else {
    if (mesh != (ON_Mesh *)0x0) {
      Destroy(mesh);
    }
    iVar22 = mesh_part->fi[0];
    if (-1 < iVar22) {
      iVar23 = mesh_part->fi[1];
      iVar16 = (this->m_F).m_count;
      if (iVar22 <= iVar23 && iVar23 <= iVar16) {
        iVar4 = mesh_part->vi[0];
        if (-1 < iVar4) {
          iVar5 = mesh_part->vi[1];
          iVar6 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
          uVar18 = iVar5 - iVar4;
          if ((uVar18 != 0 && iVar4 <= iVar5) && iVar5 <= iVar6) {
            iVar4 = (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count;
            iVar5 = (this->m_H).m_count;
            iVar7 = this->m_hidden_count;
            iVar8 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count;
            iVar9 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
            iVar10 = (this->m_C).m_count;
            iVar11 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
            iVar12 = (this->m_K).m_count;
            this_00 = mesh;
            if (mesh == (ON_Mesh *)0x0) {
              this_00 = (ON_Mesh *)operator_new(0x6e0);
              ON_Mesh(this_00,mesh_part->triangle_count,mesh_part->vertex_count,iVar8 == iVar6,
                      iVar9 == iVar6);
            }
            if ((iVar10 == iVar6) && ((uint)(this_00->m_C).m_capacity < uVar18)) {
              ON_SimpleArray<ON_Color>::SetCapacity(&this_00->m_C,(long)(int)uVar18);
            }
            if ((iVar11 == iVar6) &&
               ((uint)(this_00->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < uVar18)) {
              ON_SimpleArray<ON_2dPoint>::SetCapacity
                        (&(this_00->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)(int)uVar18);
            }
            bVar2 = iVar5 == iVar6 && 0 < iVar7;
            if ((iVar12 == iVar6) && ((uint)(this_00->m_K).m_capacity < uVar18)) {
              ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&this_00->m_K,(long)(int)uVar18);
            }
            bVar3 = 0 < iVar16 && iVar4 == iVar16;
            if ((bVar2) && ((uint)(this_00->m_H).m_capacity < uVar18)) {
              ON_SimpleArray<bool>::SetCapacity(&this_00->m_H,(long)(int)uVar18);
            }
            local_80 = mesh;
            if ((bVar3) &&
               ((uint)(this_00->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity <
                (uint)(iVar23 - iVar22))) {
              ON_SimpleArray<ON_3fVector>::SetCapacity
                        (&(this_00->m_FN).super_ON_SimpleArray<ON_3fVector>,(long)(iVar23 - iVar22))
              ;
            }
            local_48 = *(undefined8 *)mesh_part->vi;
            uStack_40 = 0;
            iVar23 = (int)local_48;
            iVar16 = (int)((ulong)local_48 >> 0x20);
            iVar22 = iVar16 - iVar23;
            if (iVar22 != 0 && iVar23 <= iVar16) {
              local_50 = &(this_00->m_N).super_ON_SimpleArray<ON_3fVector>;
              local_58 = &(this_00->m_T).super_ON_SimpleArray<ON_2fPoint>;
              local_60 = &this_00->m_C;
              local_68 = &(this_00->m_S).super_ON_SimpleArray<ON_2dPoint>;
              local_70 = &this_00->m_K;
              local_78 = &this_00->m_H;
              lVar17 = (long)iVar23;
              lVar20 = lVar17 * 4;
              lVar19 = lVar17 * 0xc;
              lVar21 = lVar17 * 8;
              lVar15 = lVar17 << 4;
              do {
                ON_SimpleArray<ON_3fPoint>::Append
                          (&(this_00->m_V).super_ON_SimpleArray<ON_3fPoint>,
                           (ON_3fPoint *)
                           ((long)&((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a)->x + lVar19));
                if (iVar8 == iVar6) {
                  ON_SimpleArray<ON_3fVector>::Append
                            (local_50,(ON_3fVector *)
                                      ((long)&((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a)->x
                                      + lVar19));
                }
                if (iVar9 == iVar6) {
                  ON_SimpleArray<ON_2fPoint>::Append
                            (local_58,(ON_2fPoint *)
                                      ((long)&((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x
                                      + lVar21));
                }
                if (iVar10 == iVar6) {
                  ON_SimpleArray<ON_Color>::Append
                            (local_60,(ON_Color *)((long)&((this->m_C).m_a)->field_0 + lVar20));
                }
                if (iVar11 == iVar6) {
                  ON_SimpleArray<ON_2dPoint>::Append
                            (local_68,(ON_2dPoint *)
                                      ((long)&((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a)->x
                                      + lVar15));
                }
                if (iVar12 == iVar6) {
                  ON_SimpleArray<ON_SurfaceCurvature>::Append
                            (local_70,(ON_SurfaceCurvature *)((long)&((this->m_K).m_a)->k1 + lVar15)
                            );
                }
                if (bVar2) {
                  local_98.vi[0]._0_1_ = (this->m_H).m_a[lVar17];
                  ON_SimpleArray<bool>::Append(local_78,(bool *)&local_98);
                  if ((char)local_98.vi[0] == '\x01') {
                    this_00->m_hidden_count = this_00->m_hidden_count + 1;
                  }
                }
                lVar17 = lVar17 + 1;
                lVar19 = lVar19 + 0xc;
                lVar21 = lVar21 + 8;
                lVar20 = lVar20 + 4;
                lVar15 = lVar15 + 0x10;
                iVar22 = iVar22 + -1;
              } while (iVar22 != 0);
            }
            if (this_00->m_hidden_count < 1) {
              ON_SimpleArray<bool>::SetCapacity(&this_00->m_H,0);
              this_00->m_hidden_count = 0;
            }
            iVar22 = mesh_part->fi[0];
            if (mesh_part->fi[1] <= iVar22) {
              return this_00;
            }
            iVar23 = (int)local_48;
            lVar21 = (long)iVar22 << 4;
            lVar20 = (long)iVar22 * 0xc;
            iVar22 = mesh_part->fi[1] - iVar22;
            iVar16 = 0;
            do {
              puVar1 = (undefined8 *)((long)((this->m_F).m_a)->vi + lVar21);
              uVar13 = *puVar1;
              uVar14 = puVar1[1];
              local_98.vi[0] = (int)uVar13;
              local_98.vi[1] = (int)((ulong)uVar13 >> 0x20);
              local_98.vi[2] = (int)uVar14;
              local_98.vi[3] = (int)((ulong)uVar14 >> 0x20);
              local_98.vi[0] = local_98.vi[0] - iVar23;
              local_98.vi[1] = local_98.vi[1] - iVar23;
              local_98.vi[2] = local_98.vi[2] - iVar23;
              local_98.vi[3] = local_98.vi[3] - iVar23;
              if ((((local_98.vi[0] < 0 || (int)uVar18 <= local_98.vi[0]) ||
                   (local_98.vi[1] < 0 || (int)uVar18 <= local_98.vi[1])) ||
                  (local_98.vi[2] < 0 || (int)uVar18 <= local_98.vi[2])) ||
                 ((int)uVar18 <= local_98.vi[3] || local_98.vi[3] < 0)) {
                iVar16 = iVar16 + 1;
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                           ,0x2e26,"","ON_Mesh::MeshPart Invalid face in partition");
              }
              else {
                ON_SimpleArray<ON_MeshFace>::Append(&this_00->m_F,&local_98);
                if (bVar3) {
                  ON_SimpleArray<ON_3fVector>::Append
                            (&(this_00->m_FN).super_ON_SimpleArray<ON_3fVector>,
                             (ON_3fVector *)
                             ((long)&((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a)->x +
                             lVar20));
                }
              }
              lVar21 = lVar21 + 0x10;
              lVar20 = lVar20 + 0xc;
              iVar22 = iVar22 + -1;
            } while (iVar22 != 0);
            if (0 < (this_00->m_F).m_count || iVar16 < 1) {
              return this_00;
            }
            if (this_00 == local_80) {
              Destroy(local_80);
            }
            else {
              (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
            }
            return (ON_Mesh *)0x0;
          }
        }
        sFormat = "ON_Mesh::MeshPart mesh_part.vi[] is not valid";
        iVar22 = 0x2dd4;
        goto LAB_0050e444;
      }
    }
    sFormat = "ON_Mesh::MeshPart mesh_part.fi[] is not valid";
    iVar22 = 0x2dcb;
  }
LAB_0050e444:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
             ,iVar22,"",sFormat);
  return (ON_Mesh *)0x0;
}

Assistant:

ON_Mesh* ON_Mesh::MeshPart( 
  const ON_MeshPart& mesh_part,
  ON_Mesh* mesh 
  ) const
{
  if ( this == mesh )
  {
    ON_ERROR("ON_Mesh::MeshPart this == mesh");
    return 0;
  }

  if ( mesh )
    mesh->Destroy();

  if (    mesh_part.fi[0] < 0 
       || mesh_part.fi[1] > m_F.Count()
       || mesh_part.fi[0] > mesh_part.fi[1]
       )
  {
    ON_ERROR("ON_Mesh::MeshPart mesh_part.fi[] is not valid");
    return 0;
  }

  if (    mesh_part.vi[0] < 0
       || mesh_part.vi[1] > m_V.Count()
       || mesh_part.vi[0] >= mesh_part.vi[1]
       )
  {
    ON_ERROR("ON_Mesh::MeshPart mesh_part.vi[] is not valid");
    return 0;
  }

  const int submesh_V_count = mesh_part.vi[1] - mesh_part.vi[0];
  const int submesh_F_count = mesh_part.fi[1] - mesh_part.fi[0];

  const bool bHasVertexNormals = HasVertexNormals();
  const bool bHasTextureCoordinates = HasTextureCoordinates();
  const bool bHasVertexColors = HasVertexColors();
  const bool bHasFaceNormals = HasFaceNormals();
  const bool bHasSurfaceParameters = HasSurfaceParameters();
  const bool bHasPrincipalCurvatures = HasPrincipalCurvatures();
  const bool bHasHiddenVertices = HiddenVertexCount() > 0;

  ON_Mesh* submesh = (0 != mesh)
                   ? mesh
                   : new ON_Mesh(mesh_part.triangle_count,
                                 mesh_part.vertex_count,
                                 bHasVertexNormals,
                                 bHasTextureCoordinates
                                 );

  if ( bHasVertexColors )
    submesh->m_C.Reserve(submesh_V_count);
  if ( bHasSurfaceParameters )
    submesh->m_S.Reserve(submesh_V_count);
  if ( bHasPrincipalCurvatures )
    submesh->m_K.Reserve(submesh_V_count);
  if ( bHasHiddenVertices )
    submesh->m_H.Reserve(submesh_V_count);
  if ( bHasFaceNormals )
    submesh->m_FN.Reserve(submesh_F_count);

  // put vertex information into submesh
  const int vi0 = mesh_part.vi[0];
  const int vi1 = mesh_part.vi[1];
  for ( int vi = vi0; vi < vi1; vi++ )
  {
    submesh->m_V.Append(m_V[vi]);
    if ( bHasVertexNormals )
      submesh->m_N.Append(m_N[vi]);
    if ( bHasTextureCoordinates )
      submesh->m_T.Append(m_T[vi]);
    if ( bHasVertexColors )
      submesh->m_C.Append(m_C[vi]);
    if ( bHasSurfaceParameters )
      submesh->m_S.Append(m_S[vi]);
    if ( bHasPrincipalCurvatures )
      submesh->m_K.Append(m_K[vi]);
    if ( bHasHiddenVertices )
    {
      bool bHidden = m_H[vi];
      submesh->m_H.Append(bHidden);
      if ( bHidden )
        submesh->m_hidden_count++;
    }
  }
  if ( submesh->m_hidden_count <= 0 )
  {
    submesh->m_H.Destroy();
    submesh->m_hidden_count = 0;
  }

  // put face information into submesh
  int bad_face_count = 0;
  const int fi0 = mesh_part.fi[0];
  const int fi1 = mesh_part.fi[1];
  for ( int fi = fi0; fi < fi1; fi++ )
  {
    ON_MeshFace f = m_F[fi];
    f.vi[0] -= vi0;
    f.vi[1] -= vi0;
    f.vi[2] -= vi0;
    f.vi[3] -= vi0;
    if (    f.vi[0] >= submesh_V_count || f.vi[0] < 0 
         || f.vi[1] >= submesh_V_count || f.vi[1] < 0 
         || f.vi[2] >= submesh_V_count || f.vi[2] < 0 
         || f.vi[3] >= submesh_V_count || f.vi[3] < 0 
         )
    {
      bad_face_count++;
      ON_ERROR("ON_Mesh::MeshPart Invalid face in partition");
      continue;
    }
    submesh->m_F.Append(f);
    if ( bHasFaceNormals )
      submesh->m_FN.Append(m_FN[fi]);
  }

  if ( submesh->m_F.Count() < 1 && bad_face_count > 0 )
  {
    if ( submesh != mesh )
      delete submesh;
    else
      mesh->Destroy();

    submesh = 0;
  }

  return submesh;
}